

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

char * __thiscall cs_impl::system_cs_ext::getenv(system_cs_ext *this,char *__name)

{
  char *pcVar1;
  undefined8 uVar2;
  char *str;
  string *in_stack_ffffffffffffff68;
  lang_error *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator *paVar3;
  allocator local_66;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = ::getenv(pcVar1);
  if (pcVar1 == (char *)0x0) {
    local_65 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::operator+(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    cs::lang_error::lang_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_65 = 0;
    __cxa_throw(uVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  paVar3 = &local_66;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_66);
  return (char *)this;
}

Assistant:

string getenv(const string &name)
		{
			const char *str = std::getenv(name.c_str());
			if (str == nullptr)
				throw lang_error("Environment variable \"" + name + "\" is not exist.");
			return str;
		}